

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

int XUtf8UcsWidth(XUtf8FontStruct *font_set,uint ucs)

{
  int *piVar1;
  XFontStruct **ppXVar2;
  int *piVar3;
  unsigned_short uVar4;
  int iVar5;
  bool bVar6;
  uint no_spc;
  int *ranges;
  int iStack_50;
  char glyph [2];
  int nb_font;
  int first;
  int fnum;
  XChar2b buf [8];
  XFontStruct **fonts;
  int *encodings;
  int x;
  uint ucs_local;
  XUtf8FontStruct *font_set_local;
  
  ranges._4_4_ = font_set->nb_font;
  if (ranges._4_4_ < 1) {
    font_set_local._4_4_ = 0;
  }
  else {
    piVar1 = font_set->ranges;
    ppXVar2 = font_set->fonts;
    piVar3 = font_set->encodings;
    nb_font = 0;
    while( true ) {
      bVar6 = false;
      if (nb_font < ranges._4_4_) {
        bVar6 = ppXVar2[nb_font] == (XFontStruct *)0x0;
      }
      if (!bVar6) break;
      nb_font = nb_font + 1;
    }
    if (nb_font < ranges._4_4_) {
      iStack_50 = nb_font;
      uVar4 = XUtf8IsNonSpacing(ucs);
      encodings._4_4_ = ucs;
      if (uVar4 != 0) {
        encodings._4_4_ = (uint)uVar4;
      }
      nb_font = iStack_50;
      while ((nb_font < ranges._4_4_ &&
             (((ppXVar2[nb_font] == (XFontStruct *)0x0 ||
               (iVar5 = ucs2fontmap((char *)((long)&ranges + 2),encodings._4_4_,piVar3[nb_font]),
               iVar5 < 0)) ||
              ((piVar3[nb_font] == 0 &&
               (((int)encodings._4_4_ < piVar1[nb_font << 1] ||
                (piVar1[nb_font * 2 + 1] < (int)encodings._4_4_))))))))) {
        nb_font = nb_font + 1;
      }
      if (nb_font == ranges._4_4_) {
        nb_font = iStack_50;
        ucs2fontmap((char *)((long)&ranges + 2),0x3f,piVar3[iStack_50]);
      }
      first._0_1_ = ranges._2_1_;
      first._1_1_ = ranges._3_1_;
      font_set_local._4_4_ = XTextWidth16(ppXVar2[nb_font],&first,1);
    }
    else {
      font_set_local._4_4_ = 0;
    }
  }
  return font_set_local._4_4_;
}

Assistant:

int
XUtf8UcsWidth(XUtf8FontStruct  *font_set,
	      unsigned int     ucs) {

  int		x;
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[8];     /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		first;      /* first valid font index */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */
  unsigned int  no_spc;

  nb_font = font_set->nb_font;
  x = 0;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return x;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return x;
  }

  first = fnum;

  no_spc = XUtf8IsNonSpacing(ucs);
  if (no_spc) ucs = no_spc;

  /*
   * find the first encoding which can be used to
   * draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] &&
	ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 || ((int)ucs >= ranges[fnum * 2] &&
	  (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  (*buf).byte1 = glyph[0];
  (*buf).byte2 = glyph[1];

  x += XTextWidth16(fonts[fnum], buf, 1);

  return x;
}